

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O0

ppointer p_hash_table_lookup(PHashTable *table,pconstpointer key)

{
  puint hash_00;
  PHashTableNode *pPVar1;
  PHashTable *local_38;
  puint hash;
  PHashTableNode *node;
  pconstpointer key_local;
  PHashTable *table_local;
  
  if (table == (PHashTable *)0x0) {
    table_local = (PHashTable *)0x0;
  }
  else {
    hash_00 = pp_hash_table_calc_hash(key,table->size);
    pPVar1 = pp_hash_table_find_node(table,key,hash_00);
    if (pPVar1 == (PHashTableNode *)0x0) {
      local_38 = (PHashTable *)0xffffffffffffffff;
    }
    else {
      local_38 = (PHashTable *)pPVar1->value;
    }
    table_local = local_38;
  }
  return table_local;
}

Assistant:

P_LIB_API ppointer
p_hash_table_lookup (const PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	hash = pp_hash_table_calc_hash (key, table->size);

	return ((node = pp_hash_table_find_node (table, key, hash)) == NULL) ? (ppointer) (-1) : node->value;
}